

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O1

void __thiscall Util::EGM96Grav::NormCoeffs2Reg(EGM96Grav *this)

{
  long lVar1;
  long lVar2;
  ActualDstType actualDst;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (((this->C_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       != 0x169) ||
     ((this->C_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      != 0x169)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->C_,0x1fd11,0x169,0x169);
  }
  lVar2 = (this->C_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows * (this->C_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
  if (0 < lVar2) {
    memset((this->C_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data,0,lVar2 * 8);
  }
  if (((this->S_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       != 0x169) ||
     ((this->S_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      != 0x169)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->S_,0x1fd11,0x169,0x169);
  }
  lVar2 = (this->S_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows * (this->S_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
  if (0 < lVar2) {
    memset((this->S_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data,0,lVar2 * 8);
  }
  dVar3 = 2.0;
  do {
    dVar4 = dVar3 + 1.0;
    if (0.0 < dVar4) {
      lVar2 = (long)(int)dVar3;
      dVar7 = 0.0;
      do {
        dVar5 = tgamma(dVar3 + dVar7 + 1.0);
        dVar6 = tgamma((dVar3 - dVar7) + 1.0);
        dVar5 = dVar5 / (dVar6 * *(double *)(&DAT_001198f0 + (ulong)((int)dVar7 == 0) * 8) *
                        (dVar3 + dVar3 + 1.0));
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        lVar1 = (long)(int)dVar7;
        (this->C_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        [(this->C_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows * lVar1 + lVar2] =
             (this->C_norm_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data
             [(this->C_norm_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows * lVar1 + lVar2] / dVar5;
        (this->S_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        [lVar1 * (this->S_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows + lVar2] =
             (this->S_norm_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data
             [(this->S_norm_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows * lVar1 + lVar2] / dVar5;
        dVar7 = dVar7 + 1.0;
      } while (dVar7 < dVar4);
    }
    dVar3 = dVar4;
  } while (dVar4 < 362.0);
  return;
}

Assistant:

void EGM96Grav::NormCoeffs2Reg(){

		//initialize matricies
		this->C_ = Eigen::MatrixXd::Zero(361,361);
		this->S_ = Eigen::MatrixXd::Zero(361,361);

		for (double ll = 2; ll < 362; ++ll) {

			for (double mm = 0; mm < ll+1; ++mm) {

				
				double k = 2.0;
				if( (int) mm == 0) {
					k = 1.0;
				}

				//intermediate values
				//Note: tgamma(i+1) = factorial(i)
				double a = tgamma(ll + mm + 1.0);
				double b = tgamma(ll - mm + 1.0);
				double c = (2.0*ll + 1.0);

				//find factor
				double Pi_lm = sqrt(a/(b*k*c));

				//update
				this->C_( (int) ll, (int) mm) = this->C_norm_( (int) ll, (int) mm)/Pi_lm;
				this->S_( (int) ll, (int) mm) = this->S_norm_( (int) ll, (int) mm)/Pi_lm;
			}
		}

	}